

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O2

void __thiscall QAction::setEnabled(QAction *this,bool b)

{
  ushort uVar1;
  QActionPrivate *this_00;
  long in_FS_OFFSET;
  char local_28 [24];
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QActionPrivate **)&this->field_0x8;
  uVar1 = *(ushort *)&this_00->field_0x188;
  if (((uVar1 & 2) == 0) || (SUB41((uVar1 & 4) >> 2,0) != b)) {
    *(ushort *)&this_00->field_0x188 = (uVar1 & 0xfff9) + (ushort)b * 4 + 2;
    if (QCoreApplication::self != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QActionPrivate::setEnabled(this_00,b,false);
        return;
      }
      goto LAB_00500835;
    }
    local_28[0] = '\x02';
    local_28[1] = '\0';
    local_28[2] = '\0';
    local_28[3] = '\0';
    local_28[0x14] = '\0';
    local_28[0x15] = '\0';
    local_28[0x16] = '\0';
    local_28[0x17] = '\0';
    local_28[4] = '\0';
    local_28[5] = '\0';
    local_28[6] = '\0';
    local_28[7] = '\0';
    local_28[8] = '\0';
    local_28[9] = '\0';
    local_28[10] = '\0';
    local_28[0xb] = '\0';
    local_28[0xc] = '\0';
    local_28[0xd] = '\0';
    local_28[0xe] = '\0';
    local_28[0xf] = '\0';
    local_28[0x10] = '\0';
    local_28[0x11] = '\0';
    local_28[0x12] = '\0';
    local_28[0x13] = '\0';
    local_10 = "default";
    QMessageLogger::warning
              (local_28,"QAction: Initialize Q(Gui)Application before calling \'setEnabled\'.");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_00500835:
  __stack_chk_fail();
}

Assistant:

void QAction::setEnabled(bool b)
{
    Q_D(QAction);
    if (d->explicitEnabledValue == b && d->explicitEnabled)
        return;
    d->explicitEnabledValue = b;
    d->explicitEnabled = true;
    QAPP_CHECK("setEnabled");
    d->setEnabled(b, false);
}